

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

pointer __thiscall
google::protobuf::
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>::
MapAllocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>::InnerMap::KeyCompare,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>::MapAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
::allocate(MapAllocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>::InnerMap::KeyCompare,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>::MapAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
           *this,size_type n,void *hint)

{
  pointer pvVar1;
  
  if (this->arena_ != (Arena *)0x0) {
    pvVar1 = (pointer)Arena::AllocateAligned
                                (this->arena_,(type_info *)&unsigned_char::typeinfo,n * 0x38);
    return pvVar1;
  }
  pvVar1 = (pointer)operator_new(n * 0x38);
  return pvVar1;
}

Assistant:

pointer allocate(size_type n, const void* hint = 0) {
      // If arena is not given, malloc needs to be called which doesn't
      // construct element object.
      if (arena_ == NULL) {
        return static_cast<pointer>(::operator new(n * sizeof(value_type)));
      } else {
        return reinterpret_cast<pointer>(
            Arena::CreateArray<uint8>(arena_, n * sizeof(value_type)));
      }
    }